

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

int sptk::world::anon_unknown_2::HarvestGeneralBodySub
              (double *boundary_f0_list,int number_of_channels,int f0_length,double actual_fs,
              int y_length,double *temporal_positions,fft_complex *y_spectrum,int fft_size,
              double f0_floor,double f0_ceil,int max_candidates,double **f0_candidates)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *f0_ceil_00;
  void *pvVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  double **in_R8;
  double *in_R9;
  double **in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  double in_XMM2_Qa;
  double **in_stack_00000018;
  int i_1;
  int number_of_candidates;
  int i;
  double **raw_f0_candidates;
  double in_stack_ffffffffffffff98;
  fft_complex *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  int iVar5;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar6;
  int in_stack_ffffffffffffffe0;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  f0_ceil_00 = operator_new__(uVar3);
  for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)in_EDX;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    *(void **)((long)f0_ceil_00 + (long)iVar6 * 8) = pvVar4;
  }
  GetRawF0Candidates(in_R9,(int)((ulong)in_XMM1_Qa >> 0x20),in_XMM2_Qa,
                     (int)((ulong)f0_ceil_00 >> 0x20),
                     (double *)CONCAT44(iVar6,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac,
                     in_stack_ffffffffffffffa0,in_stack_ffffffffffffffe0,in_stack_ffffffffffffff98,
                     (double)f0_ceil_00,in_XMM0_Qa);
  iVar6 = DetectOfficialF0Candidates
                    ((double **)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_XMM0_Qa >> 0x20),
                     (int)in_XMM0_Qa,in_ECX,in_R8);
  OverlapF0Candidates(in_EDX,iVar6,in_stack_00000018);
  for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
    pvVar4 = *(void **)((long)f0_ceil_00 + (long)iVar5 * 8);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  if (f0_ceil_00 != (void *)0x0) {
    operator_delete__(f0_ceil_00);
  }
  return iVar6;
}

Assistant:

static int HarvestGeneralBodySub(const double *boundary_f0_list,
    int number_of_channels, int f0_length, double actual_fs, int y_length,
    const double *temporal_positions, const fft_complex *y_spectrum,
    int fft_size, double f0_floor, double f0_ceil, int max_candidates,
    double **f0_candidates) {
  double **raw_f0_candidates = new double *[number_of_channels];
  for (int i = 0; i < number_of_channels; ++i)
    raw_f0_candidates[i] = new double[f0_length];

  GetRawF0Candidates(boundary_f0_list, number_of_channels,
      actual_fs, y_length, temporal_positions, f0_length, y_spectrum,
      fft_size, f0_floor, f0_ceil, raw_f0_candidates);

  int number_of_candidates = DetectOfficialF0Candidates(raw_f0_candidates,
    number_of_channels, f0_length, max_candidates, f0_candidates);

  OverlapF0Candidates(f0_length, number_of_candidates, f0_candidates);

  for (int i = 0; i < number_of_channels; ++i)
    delete[] raw_f0_candidates[i];
  delete[] raw_f0_candidates;
  return number_of_candidates;
}